

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decodeLiteralsBlock
                 (ZSTD_DCtx *dctx,void *src,size_t srcSize,void *dst,size_t dstCapacity,
                 streaming_operation streaming)

{
  HUF_DTable *dctx_00;
  ulong uVar1;
  byte bVar2;
  ZSTD_litLocation_e ZVar3;
  BYTE *pBVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  int flags;
  long lVar10;
  void *__src;
  byte bVar11;
  uint uVar12;
  ulong dstSize;
  bool bVar13;
  bool bVar14;
  int flags_00;
  ulong uVar9;
  
  if (srcSize < 2) {
    return 0xffffffffffffffec;
  }
  bVar11 = *src;
  bVar2 = bVar11 & 3;
  switch(bVar2) {
  case 0:
    bVar2 = bVar11 >> 2 & 3;
    uVar5 = 0x20000;
    if (dstCapacity < 0x20000) {
      uVar5 = dstCapacity;
    }
    if (bVar2 == 1) {
      uVar9 = (ulong)(*src >> 4);
      lVar10 = 2;
    }
    else if (bVar2 == 3) {
      if (srcSize == 2) {
        return 0xffffffffffffffec;
      }
      uVar9 = (ulong)(*src >> 4);
      lVar10 = 3;
    }
    else {
      uVar9 = (ulong)(bVar11 >> 3);
      lVar10 = 1;
    }
    if (uVar5 < uVar9) {
      return 0xffffffffffffffba;
    }
    if (dst == (void *)0x0 && uVar9 != 0) {
      return 0xffffffffffffffba;
    }
    if ((streaming == not_streaming) && (uVar9 + 0x20040 < dstCapacity)) {
      dctx->litBuffer = (BYTE *)((long)dst + 0x20020);
      pBVar4 = (BYTE *)((long)dst + uVar9 + 0x20020);
      ZVar3 = ZSTD_in_dst;
    }
    else if ((uint)uVar9 < 0x10001) {
      dctx->litBuffer = dctx->litExtraBuffer;
      pBVar4 = dctx->litExtraBuffer + uVar9;
      ZVar3 = ZSTD_not_in_dst;
    }
    else {
      dctx->litBuffer = (BYTE *)((long)dst + (uVar5 - uVar9) + 0xffe0);
      pBVar4 = (BYTE *)((long)dst + uVar9 + (uVar5 - uVar9) + -0x20);
      ZVar3 = ZSTD_split;
    }
    dctx->litBufferEnd = pBVar4;
    dctx->litBufferLocation = ZVar3;
    uVar5 = lVar10 + uVar9;
    if (lVar10 + uVar9 + 0x20 <= srcSize) {
      dctx->litPtr = (BYTE *)((long)src + lVar10);
      dctx->litSize = uVar9;
      dctx->litBufferEnd = (BYTE *)((long)src + lVar10) + uVar9;
      dctx->litBufferLocation = ZSTD_not_in_dst;
      return uVar5;
    }
    if (uVar5 <= srcSize) {
      __src = (void *)((long)src + lVar10);
      pBVar4 = dctx->litBuffer;
      sVar6 = uVar9;
      if (dctx->litBufferLocation == ZSTD_split) {
        memcpy(pBVar4,__src,uVar9 - 0x10000);
        pBVar4 = dctx->litExtraBuffer;
        __src = (void *)((long)__src + (uVar9 - 0x10000));
        sVar6 = 0x10000;
      }
      memcpy(pBVar4,__src,sVar6);
      dctx->litPtr = dctx->litBuffer;
      dctx->litSize = uVar9;
      return uVar5;
    }
    return 0xffffffffffffffec;
  case 1:
    bVar2 = bVar11 >> 2 & 3;
    sVar7 = 0x20000;
    if (dstCapacity < 0x20000) {
      sVar7 = dstCapacity;
    }
    if (bVar2 == 1) {
      if (srcSize == 2) {
        return 0xffffffffffffffec;
      }
      uVar5 = (ulong)(*src >> 4);
      lVar10 = 2;
    }
    else if (bVar2 == 3) {
      if (srcSize < 4) {
        return 0xffffffffffffffec;
      }
      uVar5 = (ulong)(*src >> 4);
      lVar10 = 3;
    }
    else {
      uVar5 = (ulong)(bVar11 >> 3);
      lVar10 = 1;
    }
    if ((dst == (void *)0x0) && (uVar5 != 0)) {
      return 0xffffffffffffffba;
    }
    if (0x20000 < (uint)uVar5) {
      return 0xffffffffffffffec;
    }
    if (uVar5 <= dstCapacity) {
      if ((streaming == not_streaming) && (uVar5 + 0x20040 < dstCapacity)) {
        dctx->litBuffer = (BYTE *)((long)dst + 0x20020);
        pBVar4 = (BYTE *)((long)dst + uVar5 + 0x20020);
        ZVar3 = ZSTD_in_dst;
        bVar13 = false;
      }
      else if ((uint)uVar5 < 0x10001) {
        dctx->litBuffer = dctx->litExtraBuffer;
        pBVar4 = dctx->litExtraBuffer + uVar5;
        bVar13 = false;
        ZVar3 = ZSTD_not_in_dst;
      }
      else {
        dctx->litBuffer = (BYTE *)((long)dst + (sVar7 - uVar5) + 0xffe0);
        pBVar4 = (BYTE *)((long)dst + uVar5 + (sVar7 - uVar5) + -0x20);
        ZVar3 = ZSTD_split;
        bVar13 = true;
      }
      dctx->litBufferEnd = pBVar4;
      dctx->litBufferLocation = ZVar3;
      pBVar4 = dctx->litBuffer;
      bVar11 = *(byte *)((long)src + lVar10);
      sVar6 = uVar5;
      if (bVar13) {
        memset(pBVar4,(uint)bVar11,uVar5 - 0x10000);
        pBVar4 = dctx->litExtraBuffer;
        bVar11 = *(byte *)((long)src + lVar10);
        sVar6 = 0x10000;
      }
      memset(pBVar4,(uint)bVar11,sVar6);
      dctx->litPtr = dctx->litBuffer;
      dctx->litSize = uVar5;
      return lVar10 + 1;
    }
    return 0xffffffffffffffba;
  case 3:
    if (dctx->litEntropy == 0) {
      return 0xffffffffffffffe2;
    }
  }
  if (srcSize < 5) {
    return 0xffffffffffffffec;
  }
  bVar11 = bVar11 >> 2 & 3;
  uVar8 = *src;
  uVar5 = 0x20000;
  if (dstCapacity < 0x20000) {
    uVar5 = dstCapacity;
  }
  bVar13 = dctx->disableHufAsm != 0;
  if (bVar11 == 2) {
    uVar12 = uVar8 >> 4 & 0x3fff;
    uVar8 = uVar8 >> 0x12;
    lVar10 = 4;
  }
  else {
    if (bVar11 != 3) {
      bVar14 = bVar11 != 0;
      uVar12 = uVar8 >> 4 & 0x3ff;
      uVar8 = uVar8 >> 0xe & 0x3ff;
      lVar10 = 3;
      goto LAB_00223735;
    }
    uVar12 = uVar8 >> 4 & 0x3ffff;
    uVar8 = uVar8 >> 0x16 | (uint)*(byte *)((long)src + 4) << 10;
    lVar10 = 5;
  }
  bVar14 = true;
LAB_00223735:
  uVar9 = (ulong)uVar8;
  if ((dst == (void *)0x0) && (uVar12 != 0)) {
    return 0xffffffffffffffba;
  }
  dstSize = (ulong)uVar12;
  if (uVar12 < 0x20001) {
    if ((bool)(bVar14 & uVar12 < 6)) {
      return 0xffffffffffffffe8;
    }
    uVar1 = lVar10 + uVar9;
    if (uVar1 <= srcSize) {
      if (uVar5 < dstSize) {
        return 0xffffffffffffffba;
      }
      if ((streaming == not_streaming) && (dstSize + 0x20040 < dstCapacity)) {
        dctx->litBuffer = (BYTE *)((long)dst + 0x20020);
        pBVar4 = (BYTE *)((long)dst + dstSize + 0x20020);
        ZVar3 = ZSTD_in_dst;
      }
      else if (uVar12 < 0x10001) {
        dctx->litBuffer = dctx->litExtraBuffer;
        pBVar4 = dctx->litExtraBuffer + dstSize;
        ZVar3 = ZSTD_not_in_dst;
      }
      else {
        pBVar4 = (BYTE *)((long)dst + uVar5);
        dctx->litBuffer = pBVar4 + -dstSize;
        ZVar3 = ZSTD_split;
      }
      dctx->litBufferEnd = pBVar4;
      dctx->litBufferLocation = ZVar3;
      if ((0x300 < uVar12) && (dctx->ddictIsCold != 0)) {
        uVar5 = 0xffffffffffffffc0;
        do {
          uVar5 = uVar5 + 0x40;
        } while (uVar5 < 0x3fc4);
      }
      flags = (uint)bVar13 << 4;
      flags_00 = (uint)bVar13 << 4;
      if (bVar2 == 3) {
        if (bVar14) {
          if (uVar12 < 6) {
            __assert_fail("litSize >= MIN_LITERALS_FOR_4_STREAMS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0xbe,
                          "size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx *, const void *, size_t, void *, size_t, const streaming_operation)"
                         );
          }
          uVar5 = HUF_decompress4X_usingDTable
                            (dctx->litBuffer,dstSize,(void *)((long)src + lVar10),uVar9,dctx->HUFptr
                             ,flags);
        }
        else {
          uVar5 = HUF_decompress1X_usingDTable
                            (dctx->litBuffer,dstSize,(void *)((long)src + lVar10),uVar9,dctx->HUFptr
                             ,flags);
        }
      }
      else {
        dctx_00 = (dctx->entropy).hufTable;
        if (bVar14) {
          uVar5 = HUF_decompress4X_hufOnly_wksp
                            (dctx_00,dctx->litBuffer,dstSize,(void *)((long)src + lVar10),uVar9,
                             dctx->workspace,0xa00,flags_00);
        }
        else {
          uVar5 = HUF_decompress1X1_DCtx_wksp
                            (dctx_00,dctx->litBuffer,dstSize,(void *)((long)src + lVar10),uVar9,
                             dctx->workspace,0xa00,flags_00);
        }
      }
      if (dctx->litBufferLocation == ZSTD_split) {
        memcpy(dctx->litExtraBuffer,dctx->litBufferEnd + -0x10000,0x10000);
        memmove(dctx->litBuffer + 0xffe0,dctx->litBuffer,dstSize - 0x10000);
        dctx->litBuffer = dctx->litBuffer + 0xffe0;
        dctx->litBufferEnd = dctx->litBufferEnd + -0x20;
      }
      if (uVar5 < 0xffffffffffffff89) {
        dctx->litPtr = dctx->litBuffer;
        dctx->litSize = dstSize;
        dctx->litEntropy = 1;
        if (bVar2 == 2) {
          dctx->HUFptr = (dctx->entropy).hufTable;
          return uVar1;
        }
        return uVar1;
      }
      return 0xffffffffffffffec;
    }
  }
  return 0xffffffffffffffec;
}

Assistant:

size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx* dctx,
                          const void* src, size_t srcSize,   /* note : srcSize < BLOCKSIZE */
                          void* dst, size_t dstCapacity, const streaming_operation streaming)
{
    DEBUGLOG(5, "ZSTD_decodeLiteralsBlock");
    RETURN_ERROR_IF(srcSize < MIN_CBLOCK_SIZE, corruption_detected, "");

    {   const BYTE* const istart = (const BYTE*) src;
        symbolEncodingType_e const litEncType = (symbolEncodingType_e)(istart[0] & 3);

        switch(litEncType)
        {
        case set_repeat:
            DEBUGLOG(5, "set_repeat flag : re-using stats from previous compressed literals block");
            RETURN_ERROR_IF(dctx->litEntropy==0, dictionary_corrupted, "");
            ZSTD_FALLTHROUGH;

        case set_compressed:
            RETURN_ERROR_IF(srcSize < 5, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need up to 5 for case 3");
            {   size_t lhSize, litSize, litCSize;
                U32 singleStream=0;
                U32 const lhlCode = (istart[0] >> 2) & 3;
                U32 const lhc = MEM_readLE32(istart);
                size_t hufSuccess;
                size_t expectedWriteSize = MIN(ZSTD_BLOCKSIZE_MAX, dstCapacity);
                int const flags = 0
                    | (ZSTD_DCtx_get_bmi2(dctx) ? HUF_flags_bmi2 : 0)
                    | (dctx->disableHufAsm ? HUF_flags_disableAsm : 0);
                switch(lhlCode)
                {
                case 0: case 1: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    /* 2 - 2 - 10 - 10 */
                    singleStream = !lhlCode;
                    lhSize = 3;
                    litSize  = (lhc >> 4) & 0x3FF;
                    litCSize = (lhc >> 14) & 0x3FF;
                    break;
                case 2:
                    /* 2 - 2 - 14 - 14 */
                    lhSize = 4;
                    litSize  = (lhc >> 4) & 0x3FFF;
                    litCSize = lhc >> 18;
                    break;
                case 3:
                    /* 2 - 2 - 18 - 18 */
                    lhSize = 5;
                    litSize  = (lhc >> 4) & 0x3FFFF;
                    litCSize = (lhc >> 22) + ((size_t)istart[4] << 10);
                    break;
                }
                RETURN_ERROR_IF(litSize > 0 && dst == NULL, dstSize_tooSmall, "NULL not handled");
                RETURN_ERROR_IF(litSize > ZSTD_BLOCKSIZE_MAX, corruption_detected, "");
                if (!singleStream)
                    RETURN_ERROR_IF(litSize < MIN_LITERALS_FOR_4_STREAMS, literals_headerWrong,
                        "Not enough literals (%zu) for the 4-streams mode (min %u)",
                        litSize, MIN_LITERALS_FOR_4_STREAMS);
                RETURN_ERROR_IF(litCSize + lhSize > srcSize, corruption_detected, "");
                RETURN_ERROR_IF(expectedWriteSize < litSize , dstSize_tooSmall, "");
                ZSTD_allocateLiteralsBuffer(dctx, dst, dstCapacity, litSize, streaming, expectedWriteSize, 0);

                /* prefetch huffman table if cold */
                if (dctx->ddictIsCold && (litSize > 768 /* heuristic */)) {
                    PREFETCH_AREA(dctx->HUFptr, sizeof(dctx->entropy.hufTable));
                }

                if (litEncType==set_repeat) {
                    if (singleStream) {
                        hufSuccess = HUF_decompress1X_usingDTable(
                            dctx->litBuffer, litSize, istart+lhSize, litCSize,
                            dctx->HUFptr, flags);
                    } else {
                        assert(litSize >= MIN_LITERALS_FOR_4_STREAMS);
                        hufSuccess = HUF_decompress4X_usingDTable(
                            dctx->litBuffer, litSize, istart+lhSize, litCSize,
                            dctx->HUFptr, flags);
                    }
                } else {
                    if (singleStream) {
#if defined(HUF_FORCE_DECOMPRESS_X2)
                        hufSuccess = HUF_decompress1X_DCtx_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), flags);
#else
                        hufSuccess = HUF_decompress1X1_DCtx_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), flags);
#endif
                    } else {
                        hufSuccess = HUF_decompress4X_hufOnly_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), flags);
                    }
                }
                if (dctx->litBufferLocation == ZSTD_split)
                {
                    ZSTD_memcpy(dctx->litExtraBuffer, dctx->litBufferEnd - ZSTD_LITBUFFEREXTRASIZE, ZSTD_LITBUFFEREXTRASIZE);
                    ZSTD_memmove(dctx->litBuffer + ZSTD_LITBUFFEREXTRASIZE - WILDCOPY_OVERLENGTH, dctx->litBuffer, litSize - ZSTD_LITBUFFEREXTRASIZE);
                    dctx->litBuffer += ZSTD_LITBUFFEREXTRASIZE - WILDCOPY_OVERLENGTH;
                    dctx->litBufferEnd -= WILDCOPY_OVERLENGTH;
                }

                RETURN_ERROR_IF(HUF_isError(hufSuccess), corruption_detected, "");

                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                dctx->litEntropy = 1;
                if (litEncType==set_compressed) dctx->HUFptr = dctx->entropy.hufTable;
                return litCSize + lhSize;
            }

        case set_basic:
            {   size_t litSize, lhSize;
                U32 const lhlCode = ((istart[0]) >> 2) & 3;
                size_t expectedWriteSize = MIN(ZSTD_BLOCKSIZE_MAX, dstCapacity);
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    RETURN_ERROR_IF(srcSize<3, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need lhSize = 3");
                    litSize = MEM_readLE24(istart) >> 4;
                    break;
                }

                RETURN_ERROR_IF(litSize > 0 && dst == NULL, dstSize_tooSmall, "NULL not handled");
                RETURN_ERROR_IF(expectedWriteSize < litSize, dstSize_tooSmall, "");
                ZSTD_allocateLiteralsBuffer(dctx, dst, dstCapacity, litSize, streaming, expectedWriteSize, 1);
                if (lhSize+litSize+WILDCOPY_OVERLENGTH > srcSize) {  /* risk reading beyond src buffer with wildcopy */
                    RETURN_ERROR_IF(litSize+lhSize > srcSize, corruption_detected, "");
                    if (dctx->litBufferLocation == ZSTD_split)
                    {
                        ZSTD_memcpy(dctx->litBuffer, istart + lhSize, litSize - ZSTD_LITBUFFEREXTRASIZE);
                        ZSTD_memcpy(dctx->litExtraBuffer, istart + lhSize + litSize - ZSTD_LITBUFFEREXTRASIZE, ZSTD_LITBUFFEREXTRASIZE);
                    }
                    else
                    {
                        ZSTD_memcpy(dctx->litBuffer, istart + lhSize, litSize);
                    }
                    dctx->litPtr = dctx->litBuffer;
                    dctx->litSize = litSize;
                    return lhSize+litSize;
                }
                /* direct reference into compressed stream */
                dctx->litPtr = istart+lhSize;
                dctx->litSize = litSize;
                dctx->litBufferEnd = dctx->litPtr + litSize;
                dctx->litBufferLocation = ZSTD_not_in_dst;
                return lhSize+litSize;
            }

        case set_rle:
            {   U32 const lhlCode = ((istart[0]) >> 2) & 3;
                size_t litSize, lhSize;
                size_t expectedWriteSize = MIN(ZSTD_BLOCKSIZE_MAX, dstCapacity);
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    RETURN_ERROR_IF(srcSize<3, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need lhSize+1 = 3");
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    RETURN_ERROR_IF(srcSize<4, corruption_detected, "srcSize >= MIN_CBLOCK_SIZE == 2; here we need lhSize+1 = 4");
                    litSize = MEM_readLE24(istart) >> 4;
                    break;
                }
                RETURN_ERROR_IF(litSize > 0 && dst == NULL, dstSize_tooSmall, "NULL not handled");
                RETURN_ERROR_IF(litSize > ZSTD_BLOCKSIZE_MAX, corruption_detected, "");
                RETURN_ERROR_IF(expectedWriteSize < litSize, dstSize_tooSmall, "");
                ZSTD_allocateLiteralsBuffer(dctx, dst, dstCapacity, litSize, streaming, expectedWriteSize, 1);
                if (dctx->litBufferLocation == ZSTD_split)
                {
                    ZSTD_memset(dctx->litBuffer, istart[lhSize], litSize - ZSTD_LITBUFFEREXTRASIZE);
                    ZSTD_memset(dctx->litExtraBuffer, istart[lhSize], ZSTD_LITBUFFEREXTRASIZE);
                }
                else
                {
                    ZSTD_memset(dctx->litBuffer, istart[lhSize], litSize);
                }
                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                return lhSize+1;
            }
        default:
            RETURN_ERROR(corruption_detected, "impossible");
        }
    }
}